

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O1

void __thiscall llvm::FoldingSetIteratorImpl::advance(FoldingSetIteratorImpl *this)

{
  FoldingSetNode *pFVar1;
  ulong *puVar2;
  FoldingSetNode *pFVar3;
  
  pFVar1 = (FoldingSetNode *)this->NodePtr->NextInFoldingSetBucket;
  pFVar3 = (FoldingSetNode *)0x0;
  if (((ulong)pFVar1 & 1) == 0) {
    pFVar3 = pFVar1;
  }
  if (pFVar3 == (FoldingSetNode *)0x0) {
    if (((ulong)pFVar1 & 1) == 0) {
      __assert_fail("(Ptr & 1) && \"Not a bucket pointer\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/FoldingSet.cpp"
                    ,0xcb,"void **GetBucketPtr(void *)");
    }
    puVar2 = (ulong *)((ulong)pFVar1 & 0xfffffffffffffffe);
    do {
      do {
        puVar2 = puVar2 + 1;
        pFVar3 = (FoldingSetNode *)*puVar2;
      } while (pFVar3 == (FoldingSetNode *)0x0);
    } while ((pFVar3 != (FoldingSetNode *)0xffffffffffffffff) &&
            (pFVar3 == (FoldingSetNode *)0x0 || ((ulong)pFVar3 & 1) != 0));
  }
  this->NodePtr = pFVar3;
  return;
}

Assistant:

void FoldingSetIteratorImpl::advance() {
  // If there is another link within this bucket, go to it.
  void *Probe = NodePtr->getNextInBucket();

  if (FoldingSetNode *NextNodeInBucket = GetNextPtr(Probe))
    NodePtr = NextNodeInBucket;
  else {
    // Otherwise, this is the last link in this bucket.
    void **Bucket = GetBucketPtr(Probe);

    // Skip to the next non-null non-self-cycle bucket.
    do {
      ++Bucket;
    } while (*Bucket != reinterpret_cast<void*>(-1) &&
             (!*Bucket || !GetNextPtr(*Bucket)));

    NodePtr = static_cast<FoldingSetNode*>(*Bucket);
  }
}